

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  int *piVar1;
  char cVar2;
  SessionHandle *data;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  CURLcode CVar9;
  int iVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  char *pcVar14;
  void *pvVar15;
  int i_2;
  ulong uVar16;
  size_t sVar17;
  char *pcVar18;
  undefined7 in_register_00000031;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  int i;
  long lVar22;
  char *pcVar23;
  uchar md5buf [16];
  char *cnonce;
  uchar *local_f8;
  size_t cnonce_sz;
  uchar ha1 [33];
  char cnoncebuf [33];
  uchar ha2 [33];
  uchar request_digest [33];
  
  cnonce = (char *)0x0;
  cnonce_sz = 0;
  data = conn->data;
  iVar10 = (int)CONCAT71(in_register_00000031,proxy);
  uVar20 = (ulong)(uint)(iVar10 << 6);
  lVar21 = 0x300;
  if (iVar10 != 0) {
    lVar21 = 0x2e8;
  }
  uVar16 = (ulong)(uint)(iVar10 << 5);
  pcVar23 = *(char **)(conn->local_ip + uVar16 + 0x38);
  pcVar18 = *(char **)(conn->local_ip + uVar16 + 0x40);
  pvVar15 = *(void **)((conn->chunk).hexbuffer + lVar21 + -8);
  local_f8 = uripath;
  if (pvVar15 != (void *)0x0) {
    (*Curl_cfree)(pvVar15);
    pcVar14 = (conn->chunk).hexbuffer + lVar21 + -8;
    pcVar14[0] = '\0';
    pcVar14[1] = '\0';
    pcVar14[2] = '\0';
    pcVar14[3] = '\0';
    pcVar14[4] = '\0';
    pcVar14[5] = '\0';
    pcVar14[6] = '\0';
    pcVar14[7] = '\0';
  }
  if (pcVar23 == (char *)0x0) {
    pcVar23 = "";
  }
  if (pcVar18 == (char *)0x0) {
    pcVar18 = "";
  }
  if (*(long *)((long)&(data->state).digest.nonce + uVar20) == 0) {
    (&(data->state).authhost.done)[uVar16] = false;
    return CURLE_OK;
  }
  (&(data->state).authhost.done)[uVar16] = true;
  if (*(int *)((long)&(data->state).digest.nc + uVar20) == 0) {
    *(undefined4 *)((long)&(data->state).digest.nc + uVar20) = 1;
  }
  if (*(long *)((long)&(data->state).digest.cnonce + uVar20) == 0) {
    uVar5 = Curl_rand(data);
    uVar6 = Curl_rand(data);
    uVar7 = Curl_rand(data);
    uVar8 = Curl_rand(data);
    curl_msnprintf(cnoncebuf,0x21,"%08x%08x%08x%08x",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
                   (ulong)uVar8);
    sVar17 = strlen(cnoncebuf);
    CVar9 = Curl_base64_encode(data,cnoncebuf,sVar17,&cnonce,&cnonce_sz);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    *(char **)((long)&(data->state).digest.cnonce + uVar20) = cnonce;
  }
  puVar11 = (uchar *)curl_maprintf("%s:%s:%s",pcVar23,
                                   *(undefined8 *)((long)&(data->state).digest.realm + uVar20),
                                   pcVar18);
  if (puVar11 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(md5buf,puVar11);
  (*Curl_cfree)(puVar11);
  puVar11 = ha1;
  lVar22 = 0;
  do {
    curl_msnprintf((char *)puVar11,3,"%02x",(ulong)md5buf[lVar22]);
    lVar22 = lVar22 + 1;
    puVar11 = puVar11 + 2;
  } while (lVar22 != 0x10);
  if (*(int *)((long)&(data->state).digest.algo + uVar20) == 1) {
    puVar11 = ha1;
    puVar12 = (uchar *)curl_maprintf("%s:%s:%s",puVar11,
                                     *(undefined8 *)((long)&(data->state).digest.nonce + uVar20),
                                     *(undefined8 *)((long)&(data->state).digest.cnonce + uVar20));
    if (puVar12 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_md5it(md5buf,puVar12);
    (*Curl_cfree)(puVar12);
    lVar22 = 0;
    do {
      curl_msnprintf((char *)puVar11,3,"%02x",(ulong)md5buf[lVar22]);
      lVar22 = lVar22 + 1;
      puVar11 = puVar11 + 2;
    } while (lVar22 != 0x10);
  }
  puVar11 = local_f8;
  if (((&(data->state).authhost.iestyle)[uVar16] == true) &&
     (pcVar18 = strchr((char *)local_f8,0x3f), pcVar18 != (char *)0x0)) {
    sVar17 = (long)pcVar18 - (long)puVar11;
  }
  else {
    sVar17 = strlen((char *)puVar11);
  }
  puVar13 = (uchar *)curl_maprintf("%s:%.*s",request,sVar17,puVar11);
  pcVar18 = *(char **)((long)&(data->state).digest.qop + uVar20);
  puVar12 = puVar13;
  if (((pcVar18 != (char *)0x0) && (iVar10 = Curl_raw_equal(pcVar18,"auth-int"), iVar10 != 0)) &&
     (puVar12 = (uchar *)curl_maprintf("%s:%s",puVar13,"d41d8cd98f00b204e9800998ecf8427e"),
     puVar13 != (uchar *)0x0)) {
    (*Curl_cfree)(puVar13);
  }
  if (puVar12 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(md5buf,puVar12);
  (*Curl_cfree)(puVar12);
  puVar12 = ha2;
  lVar22 = 0;
  do {
    curl_msnprintf((char *)puVar12,3,"%02x",(ulong)md5buf[lVar22]);
    lVar22 = lVar22 + 1;
    puVar12 = puVar12 + 2;
  } while (lVar22 != 0x10);
  uVar3 = *(undefined8 *)((long)&(data->state).digest.nonce + uVar20);
  lVar22 = *(long *)((long)&(data->state).digest.qop + uVar20);
  if (lVar22 == 0) {
    puVar12 = (uchar *)curl_maprintf("%s:%s:%s",ha1,uVar3,ha2);
  }
  else {
    puVar12 = (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",ha1,uVar3,
                                     (ulong)*(uint *)((long)&(data->state).digest.nc + uVar20),
                                     *(undefined8 *)((long)&(data->state).digest.cnonce + uVar20),
                                     lVar22,ha2);
  }
  if (puVar12 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(md5buf,puVar12);
  (*Curl_cfree)(puVar12);
  puVar12 = request_digest;
  lVar22 = 0;
  do {
    curl_msnprintf((char *)puVar12,3,"%02x",(ulong)md5buf[lVar22]);
    lVar22 = lVar22 + 1;
    puVar12 = puVar12 + 2;
  } while (lVar22 != 0x10);
  sVar19 = 1;
  pcVar18 = pcVar23;
  do {
    cVar2 = *pcVar18;
    if (cVar2 == '\"') {
LAB_0048276f:
      sVar19 = sVar19 + 2;
    }
    else {
      if (cVar2 == '\0') {
        pcVar14 = (char *)(*Curl_cmalloc)(sVar19);
        pcVar18 = pcVar14;
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        do {
          cVar2 = *pcVar23;
          if ((cVar2 == '\"') || (cVar2 == '\\')) {
            *pcVar18 = '\\';
            pcVar18 = pcVar18 + 1;
          }
          else if (cVar2 == '\0') {
            *pcVar18 = '\0';
            if (pcVar14 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pcVar23 = "";
            if (proxy) {
              pcVar23 = "Proxy-";
            }
            lVar22 = *(long *)((long)&(data->state).digest.qop + uVar20);
            uVar3 = *(undefined8 *)((long)&(data->state).digest.nonce + uVar20);
            uVar4 = *(undefined8 *)((long)&(data->state).digest.realm + uVar20);
            if (lVar22 == 0) {
              pcVar23 = curl_maprintf("%sAuthorization: Digest username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%.*s\", response=\"%s\""
                                      ,pcVar23,pcVar14,uVar4,uVar3,sVar17,puVar11,request_digest);
              *(char **)((conn->chunk).hexbuffer + lVar21 + -8) = pcVar23;
            }
            else {
              pcVar23 = curl_maprintf("%sAuthorization: Digest username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%.*s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                      ,pcVar23,pcVar14,uVar4,uVar3,sVar17,puVar11,
                                      *(undefined8 *)((long)&(data->state).digest.cnonce + uVar20),
                                      (ulong)*(uint *)((long)&(data->state).digest.nc + uVar20),
                                      lVar22,request_digest);
              *(char **)((conn->chunk).hexbuffer + lVar21 + -8) = pcVar23;
              iVar10 = Curl_raw_equal(*(char **)((long)&(data->state).digest.qop + uVar20),"auth");
              if (iVar10 != 0) {
                piVar1 = (int *)((long)&(data->state).digest.nc + uVar20);
                *piVar1 = *piVar1 + 1;
              }
            }
            (*Curl_cfree)(pcVar14);
            if (*(long *)((conn->chunk).hexbuffer + lVar21 + -8) == 0) {
              return CURLE_OUT_OF_MEMORY;
            }
            if (*(long *)((long)&(data->state).digest.opaque + uVar20) != 0) {
              pcVar23 = curl_maprintf("%s, opaque=\"%s\"");
              if (pcVar23 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar21 + -8));
              *(char **)((conn->chunk).hexbuffer + lVar21 + -8) = pcVar23;
            }
            if (*(long *)((long)&(data->state).digest.algorithm + uVar20) != 0) {
              pcVar23 = curl_maprintf("%s, algorithm=\"%s\"",
                                      *(undefined8 *)((conn->chunk).hexbuffer + lVar21 + -8));
              if (pcVar23 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar21 + -8));
              *(char **)((conn->chunk).hexbuffer + lVar21 + -8) = pcVar23;
            }
            pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar21 + -8);
            sVar17 = strlen(pcVar23);
            pvVar15 = (*Curl_crealloc)(pcVar23,sVar17 + 3);
            if (pvVar15 != (void *)0x0) {
              *(undefined1 *)((long)pvVar15 + sVar17 + 2) = 0;
              *(undefined2 *)((long)pvVar15 + sVar17) = 0xa0d;
              *(void **)((conn->chunk).hexbuffer + lVar21 + -8) = pvVar15;
              return CURLE_OK;
            }
            return CURLE_OUT_OF_MEMORY;
          }
          cVar2 = *pcVar23;
          pcVar23 = pcVar23 + 1;
          *pcVar18 = cVar2;
          pcVar18 = pcVar18 + 1;
        } while( true );
      }
      if (cVar2 == '\\') goto LAB_0048276f;
      sVar19 = sVar19 + 1;
    }
    pcVar18 = pcVar18 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  /* We have a Digest setup for this, use it!  Now, to get all the details for
     this sorted out, I must urge you dear friend to read up on the RFC2617
     section 3.2.2, */
  size_t urilen;
  unsigned char md5buf[16]; /* 16 bytes/128 bits */
  unsigned char request_digest[33];
  unsigned char *md5this;
  unsigned char ha1[33];/* 32 digits and 1 zero byte */
  unsigned char ha2[33];/* 32 digits and 1 zero byte */
  char cnoncebuf[33];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *tmp = NULL;
  char **allocuserpwd;
  size_t userlen;
  const char *userp;
  char *userp_quoted;
  const char *passwdp;
  struct auth *authp;

  struct SessionHandle *data = conn->data;
  struct digestdata *d;
  CURLcode rc;
/* The CURL_OUTPUT_DIGEST_CONV macro below is for non-ASCII machines.
   It converts digest text to ASCII so the MD5 will be correct for
   what ultimately goes over the network.
*/
#define CURL_OUTPUT_DIGEST_CONV(a, b) \
  rc = Curl_convert_to_network(a, (char *)b, strlen((const char*)b)); \
  if(rc != CURLE_OK) { \
    free(b); \
    return rc; \
  }

  if(proxy) {
    d = &data->state.proxydigest;
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->proxyuser;
    passwdp = conn->proxypasswd;
    authp = &data->state.authproxy;
  }
  else {
    d = &data->state.digest;
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp="";

  if(!passwdp)
    passwdp="";

  if(!d->nonce) {
    authp->done = FALSE;
    return CURLE_OK;
  }
  authp->done = TRUE;

  if(!d->nc)
    d->nc = 1;

  if(!d->cnonce) {
    snprintf(cnoncebuf, sizeof(cnoncebuf), "%08x%08x%08x%08x",
             Curl_rand(data), Curl_rand(data),
             Curl_rand(data), Curl_rand(data));
    rc = Curl_base64_encode(data, cnoncebuf, strlen(cnoncebuf),
                            &cnonce, &cnonce_sz);
    if(rc)
      return rc;
    d->cnonce = cnonce;
  }

  /*
    if the algorithm is "MD5" or unspecified (which then defaults to MD5):

    A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    if the algorithm is "MD5-sess" then:

    A1 = H( unq(username-value) ":" unq(realm-value) ":" passwd )
         ":" unq(nonce-value) ":" unq(cnonce-value)
  */

  md5this = (unsigned char *)
    aprintf("%s:%s:%s", userp, d->realm, passwdp);
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, ha1);

  if(d->algo == CURLDIGESTALGO_MD5SESS) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, d->nonce, d->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    CURL_OUTPUT_DIGEST_CONV(data, tmp); /* convert on non-ASCII machines */
    Curl_md5it(md5buf, (unsigned char *)tmp);
    Curl_safefree(tmp);
    md5_to_ascii(md5buf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2       = Method ":" digest-uri-value

          If the "qop" value is "auth-int", then A2 is:

      A2       = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     http://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle && ((tmp = strchr((char *)uripath, '?')) != NULL))
    urilen = tmp - (char *)uripath;
  else
    urilen = strlen((char *)uripath);

  md5this = (unsigned char *)aprintf("%s:%.*s", request, urilen, uripath);

  if(d->qop && Curl_raw_equal(d->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST at the moment.
       TODO: replace md5 of empty string with entity-body for PUT/POST */
    unsigned char *md5this2 = (unsigned char *)
      aprintf("%s:%s", md5this, "d41d8cd98f00b204e9800998ecf8427e");
    Curl_safefree(md5this);
    md5this = md5this2;
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, ha2);

  if(d->qop) {
    md5this = (unsigned char *)aprintf("%s:%s:%08x:%s:%s:%s",
                                       ha1,
                                       d->nonce,
                                       d->nc,
                                       d->cnonce,
                                       d->qop,
                                       ha2);
  }
  else {
    md5this = (unsigned char *)aprintf("%s:%s:%s",
                                       ha1,
                                       d->nonce,
                                       ha2);
  }
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, request_digest);

  /* for test case 64 (snooped from a Mozilla 1.3a request)

    Authorization: Digest username="testuser", realm="testrealm", \
    nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

    Digest parameters are all quoted strings.  Username which is provided by
    the user will need double quotes and backslashes within it escaped.  For
    the other fields, this shouldn't be an issue.  realm, nonce, and opaque
    are copied as is from the server, escapes and all.  cnonce is generated
    with web-safe characters.  uri is already percent encoded.  nc is 8 hex
    characters.  algorithm and qop with standard values only contain web-safe
    chracters.
  */
  userp_quoted = string_quoted(userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;

  if(d->qop) {
    *allocuserpwd =
      aprintf( "%sAuthorization: Digest "
               "username=\"%s\", "
               "realm=\"%s\", "
               "nonce=\"%s\", "
               "uri=\"%.*s\", "
               "cnonce=\"%s\", "
               "nc=%08x, "
               "qop=%s, "
               "response=\"%s\"",
               proxy?"Proxy-":"",
               userp_quoted,
               d->realm,
               d->nonce,
               urilen, uripath, /* this is the PATH part of the URL */
               d->cnonce,
               d->nc,
               d->qop,
               request_digest);

    if(Curl_raw_equal(d->qop, "auth"))
      d->nc++; /* The nc (from RFC) has to be a 8 hex digit number 0 padded
                  which tells to the server how many times you are using the
                  same nonce in the qop=auth mode. */
  }
  else {
    *allocuserpwd =
      aprintf( "%sAuthorization: Digest "
               "username=\"%s\", "
               "realm=\"%s\", "
               "nonce=\"%s\", "
               "uri=\"%.*s\", "
               "response=\"%s\"",
               proxy?"Proxy-":"",
               userp_quoted,
               d->realm,
               d->nonce,
               urilen, uripath, /* this is the PATH part of the URL */
               request_digest);
  }
  Curl_safefree(userp_quoted);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  /* Add optional fields */
  if(d->opaque) {
    /* append opaque */
    tmp = aprintf("%s, opaque=\"%s\"", *allocuserpwd, d->opaque);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    free(*allocuserpwd);
    *allocuserpwd = tmp;
  }

  if(d->algorithm) {
    /* append algorithm */
    tmp = aprintf("%s, algorithm=\"%s\"", *allocuserpwd, d->algorithm);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    free(*allocuserpwd);
    *allocuserpwd = tmp;
  }

  /* append CRLF + zero (3 bytes) to the userpwd header */
  userlen = strlen(*allocuserpwd);
  tmp = realloc(*allocuserpwd, userlen + 3);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;
  strcpy(&tmp[userlen], "\r\n"); /* append the data */
  *allocuserpwd = tmp;

  return CURLE_OK;
}